

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O0

void __thiscall
ExportEmitArray_Empty_Test::~ExportEmitArray_Empty_Test(ExportEmitArray_Empty_Test *this)

{
  ExportEmitArray_Empty_Test *this_local;
  
  ~ExportEmitArray_Empty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ExportEmitArray, Empty) {
    pstore::exchange::export_ns::ostringstream os;
    std::vector<int> values{};
    emit_array (os, pstore::exchange::export_ns::indent{}, std::begin (values), std::end (values),
                [] (pstore::exchange::export_ns::ostringstream & os1,
                    pstore::exchange::export_ns::indent ind, int v) { os1 << ind << v; });
    auto const actual = os.str ();
    EXPECT_EQ (actual, "[]");
}